

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::IsUnsignedIntCooperativeMatrixType
          (ValidationState_t *this,uint32_t id)

{
  Instruction *inst;
  Instruction *pIVar1;
  
  pIVar1 = FindDef(this,id);
  if ((pIVar1 != (Instruction *)0x0) &&
     (((pIVar1->inst_).opcode == 0x14ee ||
      ((pIVar1 != (Instruction *)0x0 && ((pIVar1->inst_).opcode == 0x1168)))))) {
    pIVar1 = FindDef(this,id);
    pIVar1 = FindDef(this,(pIVar1->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[2]);
    if ((pIVar1 != (Instruction *)0x0) && ((pIVar1->inst_).opcode == 0x15)) {
      return (pIVar1->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[3] == 0;
    }
  }
  return false;
}

Assistant:

bool ValidationState_t::IsUnsignedIntCooperativeMatrixType(uint32_t id) const {
  if (!IsCooperativeMatrixNVType(id) && !IsCooperativeMatrixKHRType(id))
    return false;
  return IsUnsignedIntScalarType(FindDef(id)->word(2));
}